

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option_button.cpp
# Opt level: O2

Am_Value get_real_string_from_inter_val_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Object *in_RSI;
  Am_Value AVar3;
  Am_Object button;
  Am_Value v;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(in_RSI,0x1d4,1);
  Am_Value::operator=(&v,pAVar2);
  bVar1 = Am_Value::Valid(&v);
  if (bVar1) {
    Am_Object::Am_Object(&button,&v);
    pAVar2 = Am_Object::Get(&button,0x1ae,1);
    Am_Value::operator=((Am_Value *)self,pAVar2);
    Am_Object::~Am_Object(&button);
  }
  Am_Value::~Am_Value(&v);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

Am_Define_Formula(Am_Value, get_real_string_from_inter_val)
{
  Am_Value value;
  Am_Value v;
  v = self.Peek(Am_COMPUTE_INTER_VALUE);
  if (v.Valid()) {
    Am_Object button = v;
    value = button.Peek(Am_REAL_STRING_OR_OBJ);
  }
  return value;
}